

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void scan_row_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_col,MV_REFERENCE_FRAME *rf,int row_offset,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,uint8_t *refmv_count,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  int max_row_offset,int *processed_rows)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  int iVar4;
  MB_MODE_INFO **ppMVar5;
  MB_MODE_INFO *candidate;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int i;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  bVar1 = xd->width;
  uVar6 = (cm->mi_params).mi_cols - mi_col;
  if ((int)(uint)bVar1 <= (int)uVar6) {
    uVar6 = (uint)bVar1;
  }
  uVar8 = 0x10;
  if ((int)uVar6 < 0x10) {
    uVar8 = uVar6;
  }
  uVar6 = -row_offset;
  if (0 < row_offset) {
    uVar6 = row_offset;
  }
  iVar9 = 0;
  uVar12 = 0;
  if (1 < uVar6) {
    if ((mi_col & 1U) == 0) {
      uVar12 = 1;
    }
    else {
      uVar12 = (uint)(1 < bVar1);
    }
  }
  iVar4 = xd->mi_stride;
  ppMVar5 = xd->mi;
  uVar13 = (row_offset - max_row_offset) + 1;
  for (; iVar9 < (int)uVar8; iVar9 = iVar9 + uVar10) {
    candidate = ppMVar5[(long)row_offset * (long)iVar4 + (ulong)(iVar9 + uVar12)];
    BVar2 = candidate->bsize;
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar2];
    uVar7._0_1_ = xd->width;
    uVar7._1_1_ = xd->height;
    uVar7._2_2_ = *(undefined2 *)&xd->field_0x2076;
    uVar10 = (uint)bVar3;
    if ((byte)(undefined1)uVar7 < bVar3) {
      uVar10 = uVar7;
    }
    uVar10 = uVar10 & 0xff;
    uVar11 = 2;
    if (bVar1 < 0x10) {
      if ((1 < uVar6) && (uVar10 < 3)) {
        uVar10 = uVar11;
      }
    }
    else if (uVar10 < 5) {
      uVar10 = 4;
    }
    if ((1 < (byte)(undefined1)uVar7) && ((byte)(undefined1)uVar7 <= bVar3)) {
      uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [BVar2];
      if ((int)uVar13 <
          (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar2]) {
        uVar7 = uVar13;
      }
      uVar7 = uVar7 & 0xffff;
      if (2 < uVar7) {
        uVar11 = uVar7;
      }
      *processed_rows = uVar7 + ~row_offset;
    }
    add_ref_mv_candidate
              (candidate,rf,refmv_count,ref_match_count,newmv_count,ref_mv_stack,ref_mv_weight,
               gm_mv_candidates,cm->global_motion,(short)uVar11 * (short)uVar10);
  }
  return;
}

Assistant:

static inline void scan_row_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 int mi_col, const MV_REFERENCE_FRAME rf[2],
                                 int row_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight, uint8_t *refmv_count,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates, int max_row_offset,
                                 int *processed_rows) {
  int end_mi = AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
  end_mi = AOMMIN(end_mi, mi_size_wide[BLOCK_64X64]);
  const int width_8x8 = mi_size_wide[BLOCK_8X8];
  const int width_16x16 = mi_size_wide[BLOCK_16X16];
  int col_offset = 0;
  // TODO(jingning): Revisit this part after cb4x4 is stable.
  if (abs(row_offset) > 1) {
    col_offset = 1;
    if ((mi_col & 0x01) && xd->width < width_8x8) --col_offset;
  }
  const int use_step_16 = (xd->width >= 16);
  MB_MODE_INFO **const candidate_mi0 = xd->mi + row_offset * xd->mi_stride;

  for (int i = 0; i < end_mi;) {
    const MB_MODE_INFO *const candidate = candidate_mi0[col_offset + i];
    const int candidate_bsize = candidate->bsize;
    const int n4_w = mi_size_wide[candidate_bsize];
    int len = AOMMIN(xd->width, n4_w);
    if (use_step_16)
      len = AOMMAX(width_16x16, len);
    else if (abs(row_offset) > 1)
      len = AOMMAX(len, width_8x8);

    uint16_t weight = 2;
    if (xd->width >= width_8x8 && xd->width <= n4_w) {
      uint16_t inc = AOMMIN(-max_row_offset + row_offset + 1,
                            mi_size_high[candidate_bsize]);
      // Obtain range used in weight calculation.
      weight = AOMMAX(weight, inc);
      // Update processed rows.
      *processed_rows = inc - row_offset - 1;
    }

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, len * weight);

    i += len;
  }
}